

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDASensEEtolerances(void *ida_mem)

{
  IDAMem in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x727,"IDASensEEtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_sensMallocDone == 0) {
    IDAProcessError(in_RDI,-0x28,0x730,"IDASensEEtolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Illegal attempt to call before calling IDASensInit.");
    local_4 = -0x28;
  }
  else {
    in_RDI->ida_itolS = 4;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASensEEtolerances(void* ida_mem)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Was sensitivity initialized? */

  if (IDA_mem->ida_sensMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  IDA_mem->ida_itolS = IDA_EE;

  return (IDA_SUCCESS);
}